

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

Mat6x6d * __thiscall
OpenMD::HydroProp::getDiffusionTensor
          (Mat6x6d *__return_storage_ptr__,HydroProp *this,RealType temperature)

{
  Mat6x6d XiCopy;
  RectMatrix<double,_6U,_6U> local_130;
  
  RectMatrix<double,_6U,_6U>::operator=(&local_130,&(this->Xi_).super_RectMatrix<double,_6U,_6U>);
  SquareMatrix<double,_6>::SquareMatrix(__return_storage_ptr__);
  invertMatrix<OpenMD::SquareMatrix<double,6>>
            ((SquareMatrix<double,_6> *)&local_130,__return_storage_ptr__);
  RectMatrix<double,_6U,_6U>::mul
            (&__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>,temperature * 0.0019872156);
  return __return_storage_ptr__;
}

Assistant:

Mat6x6d HydroProp::getDiffusionTensor(RealType temperature) {
    Mat6x6d XiCopy = Xi_;
    Mat6x6d D;
    invertMatrix(XiCopy, D);
    RealType kt = Constants::kb * temperature;  // in kcal mol^-1
    D *= kt;  // now in angstroms^2 fs^-1  (at least for Trans-trans)
    return D;
  }